

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::Load<wabt::interp::Simd<unsigned_short,(unsigned_char)4>>
          (Thread *this,Instr instr,Simd<unsigned_short,_(unsigned_char)__x04_> *out,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  RefVec *this_00;
  const_reference pvVar3;
  Memory *pMVar4;
  long lVar5;
  u64 uVar6;
  string local_90;
  Ptr local_70;
  Enum local_54;
  u64 local_50;
  u64 offset;
  undefined1 local_40 [8];
  Ptr memory;
  Ptr *out_trap_local;
  Simd<unsigned_short,_(unsigned_char)__x04_> *out_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  this_00 = Instance::memories(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  offset = pvVar3->index;
  RefPtr<wabt::interp::Memory>::RefPtr((RefPtr<wabt::interp::Memory> *)local_40,pSVar1,(Ref)offset);
  local_50 = PopPtr(this,(Ptr *)local_40);
  pMVar4 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_40);
  local_54 = (Enum)Memory::Load<wabt::interp::Simd<unsigned_short,(unsigned_char)4>>
                             (pMVar4,local_50,(ulong)instr.field_2.imm_u32x2.snd,out);
  bVar2 = Failed((Result)local_54);
  if (bVar2) {
    pSVar1 = this->store_;
    lVar5 = local_50 + instr.field_2.imm_u32x2.snd;
    pMVar4 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_40);
    uVar6 = Memory::ByteSize(pMVar4);
    StringPrintf_abi_cxx11_
              (&local_90,"out of bounds memory access: access at %lu+%zd >= max value %lu",lVar5,8,
               uVar6);
    Trap::New(&local_70,pSVar1,&local_90,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_70);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_40);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::Load(Instr instr, T* out, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  u64 offset = PopPtr(memory);
  TRAP_IF(Failed(memory->Load(offset, instr.imm_u32x2.snd, out)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %" PRIu64,
                       offset + instr.imm_u32x2.snd, sizeof(T),
                       memory->ByteSize()));
  return RunResult::Ok;
}